

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_REV(DisasContext_conflict1 *s,arg_rr *a)

{
  int reg;
  ulong uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    s_00 = s->uc->tcg_ctx;
    reg = a->rm;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,var,reg);
    tcg_gen_bswap32_i32_aarch64(s_00,var,var);
    store_reg(s,a->rd,var);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool trans_REV(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6) {
        return false;
    }
    return op_rr(s, a, tcg_gen_bswap32_i32);
}